

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O0

void __thiscall PInt::PInt(PInt *this,uint size,bool unsign,bool compatible)

{
  PSymbolConstNumeric *pPVar1;
  char *len;
  FName local_3c;
  FName local_38;
  FName local_34;
  FName local_30;
  uint local_2c;
  uint local_28;
  int minval;
  int maxval;
  byte local_16;
  byte local_15;
  uint local_14;
  bool compatible_local;
  bool unsign_local;
  PInt *pPStack_10;
  uint size_local;
  PInt *this_local;
  
  local_16 = compatible;
  local_15 = unsign;
  local_14 = size;
  pPStack_10 = this;
  PBasicType::PBasicType((PBasicType *)this,size,size);
  *(undefined ***)this = &PTR_StaticType_009f2ea0;
  this->Unsigned = (bool)(local_15 & 1);
  this->IntCompatible = (bool)(local_16 & 1);
  len = "%cInt%d";
  FString::Format((FString *)&this->field_0x60,"%cInt%d",(ulong)((local_15 & 1) * 2 + 0x53),
                  (ulong)local_14);
  this->field_0x58 = local_14 < 4;
  if ((local_15 & 1) == 0) {
    local_28 = (1 << ((byte)local_14 * '\b' - 1 & 0x1f)) - 1;
    local_2c = ~local_28;
    pPVar1 = (PSymbolConstNumeric *)DObject::operator_new((DObject *)0x38,(size_t)len);
    FName::FName(&local_30,NAME_Min);
    PSymbolConstNumeric::PSymbolConstNumeric(pPVar1,&local_30,(PType *)this,local_2c);
    PSymbolTable::AddSymbol((PSymbolTable *)&this->field_0x38,(PSymbol *)pPVar1);
    pPVar1 = (PSymbolConstNumeric *)DObject::operator_new((DObject *)0x38,(size_t)pPVar1);
    FName::FName(&local_34,NAME_Max);
    PSymbolConstNumeric::PSymbolConstNumeric(pPVar1,&local_34,(PType *)this,local_28);
    PSymbolTable::AddSymbol((PSymbolTable *)&this->field_0x38,(PSymbol *)pPVar1);
  }
  else {
    pPVar1 = (PSymbolConstNumeric *)DObject::operator_new((DObject *)0x38,(size_t)len);
    FName::FName(&local_38,NAME_Min);
    PSymbolConstNumeric::PSymbolConstNumeric(pPVar1,&local_38,(PType *)this,0);
    PSymbolTable::AddSymbol((PSymbolTable *)&this->field_0x38,(PSymbol *)pPVar1);
    pPVar1 = (PSymbolConstNumeric *)DObject::operator_new((DObject *)0x38,(size_t)pPVar1);
    FName::FName(&local_3c,NAME_Max);
    PSymbolConstNumeric::PSymbolConstNumeric
              (pPVar1,&local_3c,(PType *)this,(1 << (((byte)local_14 & 3) << 3)) - 1);
    PSymbolTable::AddSymbol((PSymbolTable *)&this->field_0x38,(PSymbol *)pPVar1);
  }
  SetOps(this);
  return;
}

Assistant:

PInt::PInt(unsigned int size, bool unsign, bool compatible)
: PBasicType(size, size), Unsigned(unsign), IntCompatible(compatible)
{
	mDescriptiveName.Format("%cInt%d", unsign? 'U':'S', size);

	MemberOnly = (size < 4);
	if (!unsign)
	{
		int maxval = (1 << ((8 * size) - 1)) - 1;
		int minval = -maxval - 1;
		Symbols.AddSymbol(new PSymbolConstNumeric(NAME_Min, this, minval));
		Symbols.AddSymbol(new PSymbolConstNumeric(NAME_Max, this, maxval));
	}
	else
	{
		Symbols.AddSymbol(new PSymbolConstNumeric(NAME_Min, this, 0u));
		Symbols.AddSymbol(new PSymbolConstNumeric(NAME_Max, this, (1u << (8 * size)) - 1));
	}
	SetOps();
}